

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O0

void aom_scaled_2d_ssse3(uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
                        InterpKernel *filter,int x0_q4,int x_step_q4,int y0_q4,int y_step_q4,int w,
                        int h)

{
  int iVar1;
  int in_stack_00000010;
  int in_stack_00000018;
  int intermediate_height;
  uint8_t temp [9152];
  int in_stack_ffffffffffffdbfc;
  undefined4 in_stack_ffffffffffffdc00;
  ptrdiff_t in_stack_ffffffffffffdc08;
  uint8_t *in_stack_ffffffffffffdc10;
  ptrdiff_t in_stack_ffffffffffffdc18;
  uint8_t *in_stack_ffffffffffffdc20;
  int in_stack_ffffffffffffdc2c;
  int in_stack_ffffffffffffdc30;
  undefined4 in_stack_ffffffffffffdc34;
  int in_stack_ffffffffffffdc38;
  undefined4 in_stack_ffffffffffffdc3c;
  int in_stack_ffffffffffffdc40;
  undefined4 in_stack_ffffffffffffdc44;
  ptrdiff_t in_stack_ffffffffffffdc48;
  uint8_t *in_stack_ffffffffffffdc50;
  int in_stack_ffffffffffffdc5c;
  int in_stack_ffffffffffffdc60;
  undefined4 in_stack_ffffffffffffdc64;
  int in_stack_ffffffffffffdc68;
  undefined4 in_stack_ffffffffffffdc6c;
  int in_stack_ffffffffffffdc70;
  undefined4 in_stack_ffffffffffffdc74;
  ptrdiff_t in_stack_ffffffffffffdc78;
  uint8_t *in_stack_ffffffffffffdc80;
  int in_stack_ffffffffffffdc90;
  int in_stack_ffffffffffffdc98;
  int in_stack_ffffffffffffdca0;
  
  iVar1 = ((temp._8_4_ + -1) * in_stack_00000018 + in_stack_00000010 >> 4) + 8;
  if ((int)temp._0_4_ < 8) {
    scaledconvolve_horiz_w4
              (in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc48,
               (uint8_t *)CONCAT44(in_stack_ffffffffffffdc44,in_stack_ffffffffffffdc40),
               CONCAT44(in_stack_ffffffffffffdc3c,in_stack_ffffffffffffdc38),
               (InterpKernel *)CONCAT44(in_stack_ffffffffffffdc34,in_stack_ffffffffffffdc30),
               in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc60,in_stack_ffffffffffffdc68,
               in_stack_ffffffffffffdc70);
  }
  else {
    scaledconvolve_horiz_w8
              (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,
               (uint8_t *)CONCAT44(in_stack_ffffffffffffdc74,in_stack_ffffffffffffdc70),
               CONCAT44(in_stack_ffffffffffffdc6c,in_stack_ffffffffffffdc68),
               (InterpKernel *)CONCAT44(in_stack_ffffffffffffdc64,in_stack_ffffffffffffdc60),
               in_stack_ffffffffffffdc5c,in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc98,
               in_stack_ffffffffffffdca0);
  }
  if ((int)temp._0_4_ < 0x10) {
    if (temp._0_4_ == 8) {
      scaledconvolve_vert_w8
                (in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc10,
                 in_stack_ffffffffffffdc08,(InterpKernel *)CONCAT44(iVar1,in_stack_ffffffffffffdc00)
                 ,in_stack_ffffffffffffdbfc,in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc38,
                 in_stack_ffffffffffffdc40);
    }
    else {
      scaledconvolve_vert_w4
                (in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc10,
                 in_stack_ffffffffffffdc08,(InterpKernel *)CONCAT44(iVar1,in_stack_ffffffffffffdc00)
                 ,in_stack_ffffffffffffdbfc,in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc38,
                 in_stack_ffffffffffffdc40);
    }
  }
  else {
    scaledconvolve_vert_w16
              (in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc10,
               in_stack_ffffffffffffdc08,(InterpKernel *)CONCAT44(iVar1,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbfc,in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc38,
               in_stack_ffffffffffffdc40);
  }
  return;
}

Assistant:

void aom_scaled_2d_ssse3(const uint8_t *src, ptrdiff_t src_stride, uint8_t *dst,
                         ptrdiff_t dst_stride, const InterpKernel *filter,
                         int x0_q4, int x_step_q4, int y0_q4, int y_step_q4,
                         int w, int h) {
  // Note: Fixed size intermediate buffer, temp, places limits on parameters.
  // 2d filtering proceeds in 2 steps:
  //   (1) Interpolate horizontally into an intermediate buffer, temp.
  //   (2) Interpolate temp vertically to derive the sub-pixel result.
  // Deriving the maximum number of rows in the temp buffer (135):
  // --Smallest scaling factor is x1/2 ==> y_step_q4 = 32 (Normative).
  // --Largest block size is 64x64 pixels.
  // --64 rows in the downscaled frame span a distance of (64 - 1) * 32 in the
  //   original frame (in 1/16th pixel units).
  // --Must round-up because block may be located at sub-pixel position.
  // --Require an additional SUBPEL_TAPS rows for the 8-tap filter tails.
  // --((64 - 1) * 32 + 15) >> 4 + 8 = 135.
  // --Require an additional 8 rows for the horiz_w8 transpose tail.
  // When calling in frame scaling function, the smallest scaling factor is x1/4
  // ==> y_step_q4 = 64. Since w and h are at most 16, the temp buffer is still
  // big enough.
  DECLARE_ALIGNED(16, uint8_t, temp[(135 + 8) * 64]);
  const int intermediate_height =
      (((h - 1) * y_step_q4 + y0_q4) >> SUBPEL_BITS) + SUBPEL_TAPS;

  assert(w <= 64);
  assert(h <= 64);
  assert(y_step_q4 <= 32 || (y_step_q4 <= 64 && h <= 32));
  assert(x_step_q4 <= 64);

  if (w >= 8) {
    scaledconvolve_horiz_w8(src - src_stride * (SUBPEL_TAPS / 2 - 1),
                            src_stride, temp, 64, filter, x0_q4, x_step_q4, w,
                            intermediate_height);
  } else {
    scaledconvolve_horiz_w4(src - src_stride * (SUBPEL_TAPS / 2 - 1),
                            src_stride, temp, 64, filter, x0_q4, x_step_q4, w,
                            intermediate_height);
  }

  if (w >= 16) {
    scaledconvolve_vert_w16(temp + 64 * (SUBPEL_TAPS / 2 - 1), 64, dst,
                            dst_stride, filter, y0_q4, y_step_q4, w, h);
  } else if (w == 8) {
    scaledconvolve_vert_w8(temp + 64 * (SUBPEL_TAPS / 2 - 1), 64, dst,
                           dst_stride, filter, y0_q4, y_step_q4, w, h);
  } else {
    scaledconvolve_vert_w4(temp + 64 * (SUBPEL_TAPS / 2 - 1), 64, dst,
                           dst_stride, filter, y0_q4, y_step_q4, w, h);
  }
}